

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessAnnounce
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  bool bVar1;
  size_type sVar2;
  element_type *this_00;
  Value *pVVar3;
  const_reference pvVar4;
  element_type *peVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view fmt;
  format_args args;
  ErrorCode local_3f4;
  undefined8 local_3f0;
  Error local_3e8;
  Value local_3c0;
  ErrorCode local_374;
  Error local_370;
  Value local_348;
  ErrorCode local_2fc;
  Error local_2f8;
  Value local_2d0;
  ErrorCode local_284;
  Error local_280;
  Value local_258;
  ErrorCode local_20c;
  Error local_208;
  Value local_1e0;
  anon_class_1_0_00000001 local_182;
  v10 local_181;
  v10 *local_180;
  size_t local_178;
  string local_170;
  Error local_150;
  Value local_128;
  undefined1 local_e0 [8];
  CommissionerAppPtr commissioner;
  unsigned_short local_c8;
  byte local_c5;
  uint local_c4;
  uint16_t period;
  uint8_t count;
  uint32_t channelMask;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Value **local_38;
  undefined1 *local_30;
  Value **local_28;
  Value **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  _period = aExpr;
  aExpr_local = (Expression *)this;
  this_local = (Interpreter *)__return_storage_ptr__;
  Value::Value(__return_storage_ptr__);
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_e0,(nullptr_t)0x0);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(_period);
  if (sVar2 < 5) {
    ProcessAnnounce::anon_class_1_0_00000001::operator()(&local_182);
    local_58 = &local_180;
    local_60 = &local_181;
    bVar6 = ::fmt::v10::operator()(local_60);
    local_178 = bVar6.size_;
    local_180 = (v10 *)bVar6.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_170;
    local_78 = local_180;
    sStack_70 = local_178;
    local_50 = &local_78;
    local_88 = local_180;
    local_80 = local_178;
    local_48 = local_88;
    sStack_40 = local_80;
    value = (Value *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &value;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_170,local_88,fmt,args);
    Error::Error(&local_150,kInvalidArgs,&local_170);
    Value::Value(&local_128,&local_150);
    Value::operator=(__return_storage_ptr__,&local_128);
    Value::~Value(&local_128);
    Error::~Error(&local_150);
    std::__cxx11::string::~string((string *)&local_170);
  }
  else {
    this_00 = std::
              __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->mJobManager);
    JobManager::GetSelectedCommissioner(&local_208,this_00,(CommissionerAppPtr *)local_e0);
    Value::Value(&local_1e0,&local_208);
    pVVar3 = Value::operator=(__return_storage_ptr__,&local_1e0);
    local_20c = kNone;
    bVar1 = Value::operator!=(pVVar3,&local_20c);
    Value::~Value(&local_1e0);
    Error::~Error(&local_208);
    if (!bVar1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](_period,1);
      utils::ParseInteger<unsigned_int>(&local_280,&local_c4,pvVar4);
      Value::Value(&local_258,&local_280);
      pVVar3 = Value::operator=(__return_storage_ptr__,&local_258);
      local_284 = kNone;
      bVar1 = Value::operator!=(pVVar3,&local_284);
      Value::~Value(&local_258);
      Error::~Error(&local_280);
      if (!bVar1) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](_period,2);
        utils::ParseInteger<unsigned_char>(&local_2f8,&local_c5,pvVar4);
        Value::Value(&local_2d0,&local_2f8);
        pVVar3 = Value::operator=(__return_storage_ptr__,&local_2d0);
        local_2fc = kNone;
        bVar1 = Value::operator!=(pVVar3,&local_2fc);
        Value::~Value(&local_2d0);
        Error::~Error(&local_2f8);
        if (!bVar1) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](_period,3);
          utils::ParseInteger<unsigned_short>(&local_370,&local_c8,pvVar4);
          Value::Value(&local_348,&local_370);
          pVVar3 = Value::operator=(__return_storage_ptr__,&local_348);
          local_374 = kNone;
          bVar1 = Value::operator!=(pVVar3,&local_374);
          Value::~Value(&local_348);
          Error::~Error(&local_370);
          if (!bVar1) {
            peVar5 = std::
                     __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_e0);
            std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_short,void>
                      ((duration<long,std::ratio<1l,1000l>> *)&local_3f0,&local_c8);
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](_period,4);
            (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x45])
                      (&local_3e8,peVar5,(ulong)local_c4,(ulong)local_c5,local_3f0,pvVar4);
            Value::Value(&local_3c0,&local_3e8);
            pVVar3 = Value::operator=(__return_storage_ptr__,&local_3c0);
            local_3f4 = kNone;
            Value::operator!=(pVVar3,&local_3f4);
            Value::~Value(&local_3c0);
            Error::~Error(&local_3e8);
          }
        }
      }
    }
  }
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_e0);
  if ((commissioner.
       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._7_1_ & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessAnnounce(const Expression &aExpr)
{
    uint32_t           channelMask;
    uint8_t            count;
    uint16_t           period;
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    SuccessOrExit(value = ParseInteger(channelMask, aExpr[1]));
    SuccessOrExit(value = ParseInteger(count, aExpr[2]));
    SuccessOrExit(value = ParseInteger(period, aExpr[3]));
    SuccessOrExit(value =
                      commissioner->AnnounceBegin(channelMask, count, CommissionerApp::MilliSeconds(period), aExpr[4]));
exit:
    return value;
}